

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_put.c
# Opt level: O2

int buffer_put(buffer *s,char *buf,uint len)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  
  uVar3 = s->p;
  uVar1 = s->n;
  if (uVar1 - uVar3 < len) {
    iVar2 = buffer_flush(s);
    if (iVar2 == -1) {
      return -1;
    }
    uVar3 = 0x2000;
    if (0x2000 < uVar1) {
      uVar3 = uVar1;
    }
    for (; s->n < len; len = len - uVar3) {
      if (len <= uVar3) {
        uVar3 = len;
      }
      iVar2 = allwrite(s->op,s->fd,buf,uVar3);
      if (iVar2 == -1) {
        return -1;
      }
      buf = buf + uVar3;
    }
    uVar3 = s->p;
  }
  byte_copy(s->x + uVar3,len,buf);
  s->p = s->p + len;
  return 0;
}

Assistant:

int buffer_put(buffer *s,const char *buf,unsigned int len)
{
  unsigned int n;
 
  n = s->n;
  if (len > n - s->p) {
    if (buffer_flush(s) == -1) return -1;
    /* now s->p == 0 */
    if (n < BUFFER_OUTSIZE) n = BUFFER_OUTSIZE;
    while (len > s->n) {
      if (n > len) n = len;
      if (allwrite(s->op,s->fd,buf,n) == -1) return -1;
      buf += n;
      len -= n;
    }
  }
  /* now len <= s->n - s->p */
  byte_copy(s->x + s->p,len,buf);
  s->p += len;
  return 0;
}